

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::NewKey
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,FName *key)

{
  FName FVar1;
  undefined4 uVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  FName local_14;
  
  uVar8 = key->Index;
  pNVar5 = this->Nodes;
  uVar9 = this->Size - 1;
  uVar10 = uVar9 & uVar8;
  pNVar3 = pNVar5 + uVar10;
  pNVar4 = pNVar3->Next;
  if (pNVar4 != (Node *)0x1) {
    pNVar7 = this->LastFree;
    do {
      pNVar6 = pNVar7;
      pNVar7 = pNVar6 + -1;
      if (pNVar6 <= pNVar5) {
        this->LastFree = pNVar7;
        Resize(this,this->Size * 2);
        pNVar3 = NewKey(this,&local_14);
        return pNVar3;
      }
    } while (pNVar7->Next != (Node *)0x1);
    this->LastFree = pNVar7;
    uVar9 = uVar9 & (pNVar3->Pair).Key.Index;
    if (uVar9 == uVar10) {
      pNVar7->Next = pNVar4;
      pNVar5 = pNVar7;
      goto LAB_0039ec39;
    }
    pNVar5 = pNVar5 + uVar9;
    do {
      pNVar4 = pNVar5;
      pNVar5 = pNVar4->Next;
    } while (pNVar5 != pNVar3);
    pNVar4->Next = pNVar7;
    pNVar6[-1].Pair.Value = (pNVar3->Pair).Value;
    FVar1.Index = (pNVar3->Pair).Key.Index;
    uVar2 = *(undefined4 *)&(pNVar3->Pair).field_0x4;
    pNVar7->Next = pNVar3->Next;
    pNVar6[-1].Pair.Key = (FName)FVar1.Index;
    *(undefined4 *)&pNVar6[-1].Pair.field_0x4 = uVar2;
    uVar8 = key->Index;
  }
  pNVar7 = (Node *)0x0;
  pNVar5 = pNVar3;
LAB_0039ec39:
  pNVar3->Next = pNVar7;
  this->NumUsed = this->NumUsed + 1;
  (pNVar5->Pair).Key.Index = uVar8;
  return pNVar5;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}